

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void YellowBold(void)

{
  std::operator<<((ostream *)&std::cout,"\x1b[49m\x1b[1;33m");
  return;
}

Assistant:

void YellowBold()
{
#ifdef _WIN32
	auto h = WinColor();
	SetConsoleTextAttribute(h, FOREGROUND_RED | FOREGROUND_GREEN | FOREGROUND_INTENSITY);
#else
	std::cout << "\033[49m\033[1;33m";
#endif
}